

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall libcellml::Generator::GeneratorImpl::addOriginCommentCode(GeneratorImpl *this)

{
  bool bVar1;
  char *__s;
  string profileInformation;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  GeneratorProfile::commentString_abi_cxx11_
            (&local_150,
             (this->mProfile).
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_150._M_string_length != 0) {
    GeneratorProfile::originCommentString_abi_cxx11_
              (&local_130,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    if (local_130._M_string_length == 0) {
      return;
    }
    bVar1 = modifiedProfile(this);
    __s = "the ";
    if (bVar1) {
      __s = "a modified ";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,__s,(allocator<char> *)&local_130);
    GeneratorProfile::profile
              ((this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::append((char *)&local_150);
    std::__cxx11::string::append((char *)&local_150);
    GeneratorProfile::commentString_abi_cxx11_
              (&local_30,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"[CODE]",&local_151);
    GeneratorProfile::originCommentString_abi_cxx11_
              (&local_b0,
               (this->mProfile).
               super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"[PROFILE_INFORMATION]",&local_152);
    replace(&local_90,&local_b0,&local_d0,&local_150);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"[LIBCELLML_VERSION]",&local_153);
    versionString_abi_cxx11_();
    replace(&local_70,&local_90,&local_f0,&local_110);
    replace(&local_130,&local_30,&local_50,&local_70);
    std::__cxx11::string::append((string *)&this->mCode);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void Generator::GeneratorImpl::addOriginCommentCode()
{
    if (!mProfile->commentString().empty()
        && !mProfile->originCommentString().empty()) {
        std::string profileInformation = modifiedProfile() ?
                                             "a modified " :
                                             "the ";

        profileInformation += (mProfile->profile() == GeneratorProfile::Profile::C) ?
                                  "C" :
                                  "Python";
        profileInformation += " profile of";

        mCode += replace(mProfile->commentString(),
                         "[CODE]", replace(replace(mProfile->originCommentString(), "[PROFILE_INFORMATION]", profileInformation), "[LIBCELLML_VERSION]", versionString()));
    }
}